

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

uint32_t cpu_lduw_data_ra_mips64(CPUArchState_conflict11 *env,target_ulong ptr,uintptr_t retaddr)

{
  uint32_t uVar1;
  uint mmu_idx;
  
  mmu_idx = 3;
  if ((env->hflags >> 0x1c & 1) == 0) {
    mmu_idx = env->hflags & 3;
  }
  uVar1 = cpu_lduw_mmuidx_ra_mips64(env,ptr,mmu_idx,retaddr);
  return uVar1;
}

Assistant:

uint32_t cpu_lduw_data_ra(CPUArchState *env, target_ulong ptr,
                          uintptr_t retaddr)
{
    return cpu_lduw_mmuidx_ra(env, ptr, cpu_mmu_index(env, false), retaddr);
}